

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DebugStringReservedRangeMax_Test::
TestBody(ValidationErrorTest_DebugStringReservedRangeMax_Test *this)

{
  bool bVar1;
  int value;
  FileDescriptor *this_00;
  char *message;
  Arg *in_R9;
  string_view format;
  AssertHelper local_108;
  Message local_100;
  string local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  Arg local_b8;
  Arg local_88;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  string_view local_28;
  FileDescriptor *local_18;
  FileDescriptor *file;
  ValidationErrorTest_DebugStringReservedRangeMax_Test *this_local;
  
  file = (FileDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,
             "name: \"foo.proto\" enum_type {   name: \"Bar\"  value { name:\"BAR\" number:1 }  reserved_range { start: 5 end: $0 }}message_type {  name: \"Foo\"  reserved_range { start: 5 end: $1 }}"
            );
  value = std::numeric_limits<int>::max();
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_88,value);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_b8,0x20000000);
  format._M_str = (char *)&local_88;
  format._M_len = (size_t)local_58._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_48,(lts_20250127 *)local_58._M_len,format,&local_b8,in_R9);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  this_00 = ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  local_18 = this_00;
  FileDescriptor::DebugString_abi_cxx11_(&local_f8,this_00);
  testing::internal::EqHelper::
  Compare<char[105],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d8,
             "\"syntax = \\\"proto2\\\";\\n\\n\" \"enum Bar {\\n\" \"  BAR = 1;\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\" \"message Foo {\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\""
             ,"file->DebugString()",
             (char (*) [105])
             "syntax = \"proto2\";\n\nenum Bar {\n  BAR = 1;\n  reserved 5 to max;\n}\n\nmessage Foo {\n  reserved 5 to max;\n}\n\n"
             ,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x13be,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DebugStringReservedRangeMax) {
  const FileDescriptor* file = BuildFile(absl::Substitute(
      "name: \"foo.proto\" "
      "enum_type { "
      "  name: \"Bar\""
      "  value { name:\"BAR\" number:1 }"
      "  reserved_range { start: 5 end: $0 }"
      "}"
      "message_type {"
      "  name: \"Foo\""
      "  reserved_range { start: 5 end: $1 }"
      "}",
      std::numeric_limits<int>::max(), FieldDescriptor::kMaxNumber + 1));

  ASSERT_EQ(
      "syntax = \"proto2\";\n\n"
      "enum Bar {\n"
      "  BAR = 1;\n"
      "  reserved 5 to max;\n"
      "}\n\n"
      "message Foo {\n"
      "  reserved 5 to max;\n"
      "}\n\n",
      file->DebugString());
}